

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.h
# Opt level: O1

void __thiscall
psql::
channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
::read<psql::empty_message<(unsigned_char)51>>
          (channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
           *this,empty_message<(unsigned_char)_3_> *msg,bytestring *buffer)

{
  pointer puVar1;
  pointer puVar2;
  char cVar3;
  runtime_error *prVar4;
  size_t in_RCX;
  system_error_category *psVar5;
  ulong uVar6;
  uint8_t msg_type;
  char local_49;
  undefined8 *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_49 = '\0';
  channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::read((channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
          *)this,(int)buffer,&local_49,in_RCX);
  if (local_49 != '3') {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Unexpected msg type");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar2 - (long)puVar1 < 0) {
    __assert_fail("last_ >= first_",
                  "/workspace/llm4binary/github/license_c_cmakelists/anarthal[P]postgres-asio/include/psql/serialization_ctx.h"
                  ,0x13,
                  "psql::deserialization_context::deserialization_context(const std::uint8_t *, const std::uint8_t *)"
                 );
  }
  if (puVar2 == puVar1) {
    psVar5 = &boost::system::detail::cat_holder<void>::system_category_instance;
    uVar6 = 0;
  }
  else {
    uVar6 = 0x100000003;
    psVar5 = (system_error_category *)&psql_error_category;
    if ((DAT_0011b368 != -0x70502de1da3a1f65) && (DAT_0011b368 != -0x4d54ee85da8120f3)) {
      psVar5 = (system_error_category *)&psql_error_category;
      cVar3 = (**(code **)(psql_error_category + 0x30))(&psql_error_category,3);
      if (cVar3 == '\0') {
        uVar6 = 3;
      }
    }
  }
  local_48 = &local_38;
  uStack_30 = 0;
  uStack_40 = 0;
  local_38 = 0;
  if (uVar6 >> 0x20 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x40);
    std::runtime_error::runtime_error(prVar4,(string *)&local_48);
    *(undefined ***)prVar4 = &PTR__system_error_0011a088;
    *(ulong *)(prVar4 + 0x10) = uVar6;
    *(system_error_category **)(prVar4 + 0x18) = psVar5;
    *(runtime_error **)(prVar4 + 0x20) = prVar4 + 0x30;
    *(undefined8 *)(prVar4 + 0x28) = 0;
    prVar4[0x30] = (runtime_error)0x0;
    __cxa_throw(prVar4,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  return;
}

Assistant:

void read(Message& msg, bytestring& buffer)
	{
		std::uint8_t msg_type = 0;
		read(buffer, msg_type);
		if (msg_type != Message::message_type) throw std::runtime_error("Unexpected msg type");
		deserialization_context ctx (boost::asio::buffer(buffer));
		auto err = deserialize_message(msg, ctx);
		check_error_code(err, error_info());
	}